

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O2

bool computeScatterDataRegressionError(HighsScatterData *scatter_data,bool print)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  HighsInt point;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double local_50;
  
  if (scatter_data->have_regression_coeff_ == true) {
    if (scatter_data->num_point_ < scatter_data->max_num_point_) {
      bVar4 = false;
    }
    else {
      if (print) {
        puts("Log regression\nPoint     Value0     Value1 PredValue1      Error");
      }
      local_50 = 0.0;
      for (uVar5 = 0; (long)uVar5 < (long)scatter_data->max_num_point_; uVar5 = uVar5 + 1) {
        if (scatter_data->have_regression_coeff_ == true) {
          dVar7 = (scatter_data->value0_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar5];
          dVar1 = (scatter_data->value1_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar5];
          dVar2 = scatter_data->log_coeff0_;
          dVar6 = pow(dVar7,scatter_data->log_coeff1_);
          dVar6 = dVar6 * dVar2;
          dVar2 = ABS(dVar6 - dVar1);
          if (print) {
            printf("%5d %10.4g %10.4g %10.4g %10.4g\n",dVar7,dVar1,dVar6,SUB84(dVar2,0),
                   uVar5 & 0xffffffff);
          }
          local_50 = local_50 + dVar2;
        }
      }
      if (print) {
        printf("                                       %10.4g\n",local_50);
        puts("Linear regression\nPoint     Value0     Value1 PredValue1      Error");
      }
      dVar7 = 0.0;
      for (uVar5 = 0; (long)uVar5 < (long)scatter_data->max_num_point_; uVar5 = uVar5 + 1) {
        if (scatter_data->have_regression_coeff_ == true) {
          dVar1 = (scatter_data->value0_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar5];
          dVar2 = (scatter_data->value1_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar5];
          dVar6 = scatter_data->linear_coeff1_;
          dVar3 = scatter_data->linear_coeff0_;
          if (print) {
            printf("%5d %10.4g %10.4g %10.4g %10.4g\n",uVar5 & 0xffffffff);
          }
          dVar7 = dVar7 + ABS((dVar6 * dVar1 + dVar3) - dVar2);
        }
      }
      if (print) {
        printf("                                       %10.4g\n",dVar7);
      }
      scatter_data->log_regression_error_ = local_50;
      scatter_data->linear_regression_error_ = dVar7;
      bVar4 = true;
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool computeScatterDataRegressionError(HighsScatterData& scatter_data,
                                       const bool print) {
  if (!scatter_data.have_regression_coeff_) return false;
  if (scatter_data.num_point_ < scatter_data.max_num_point_) return false;
  double sum_log_error = 0;
  if (print)
    printf(
        "Log regression\nPoint     Value0     Value1 PredValue1      Error\n");
  for (HighsInt point = 0; point < scatter_data.max_num_point_; point++) {
    double value0 = scatter_data.value0_[point];
    double value1 = scatter_data.value1_[point];
    double predicted_value1;
    if (predictFromScatterData(scatter_data, value0, predicted_value1, true)) {
      double error = fabs(predicted_value1 - value1);  // / fabs(value1);
      if (
          //	10*error > awful_regression_error &&
          print)
        printf("%5" HIGHSINT_FORMAT " %10.4g %10.4g %10.4g %10.4g\n", point,
               value0, value1, predicted_value1, error);
      sum_log_error += error;
    }
  }
  if (print)
    printf("                                       %10.4g\n", sum_log_error);
  double sum_linear_error = 0;
  if (print)
    printf(
        "Linear regression\nPoint     Value0     Value1 PredValue1      "
        "Error\n");
  for (HighsInt point = 0; point < scatter_data.max_num_point_; point++) {
    double value0 = scatter_data.value0_[point];
    double value1 = scatter_data.value1_[point];
    double predicted_value1;
    if (predictFromScatterData(scatter_data, value0, predicted_value1)) {
      double error = fabs(predicted_value1 - value1);  //  / fabs(value1);
      if (
          //	10*error > awful_regression_error &&
          print)
        printf("%5" HIGHSINT_FORMAT " %10.4g %10.4g %10.4g %10.4g\n", point,
               value0, value1, predicted_value1, error);
      sum_linear_error += error;
    }
  }
  if (print)
    printf("                                       %10.4g\n", sum_linear_error);
  scatter_data.log_regression_error_ = sum_log_error;
  scatter_data.linear_regression_error_ = sum_linear_error;
  return true;
}